

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

int do_open_via_path(char *dir,char *name,char *ext,char *dirresult,char **nameresult,uint size,
                    int bin,t_namelist *searchpath)

{
  int iVar1;
  int local_4c;
  t_namelist *ptStack_48;
  int fd;
  t_namelist *nl;
  char **ppcStack_38;
  uint size_local;
  char **nameresult_local;
  char *dirresult_local;
  char *ext_local;
  char *name_local;
  char *dir_local;
  
  local_4c = -1;
  nl._4_4_ = size;
  ppcStack_38 = nameresult;
  nameresult_local = (char **)dirresult;
  dirresult_local = ext;
  ext_local = name;
  name_local = dir;
  iVar1 = sys_open_absolute(name,ext,dirresult,nameresult,size,bin,&local_4c);
  if (iVar1 == 0) {
    local_4c = sys_trytoopenone(name_local,ext_local,dirresult_local,(char *)nameresult_local,
                                ppcStack_38,nl._4_4_,bin);
    dir_local._4_4_ = local_4c;
    if (local_4c < 0) {
      for (ptStack_48 = (pd_maininstance.pd_stuff)->st_temppath; ptStack_48 != (t_namelist *)0x0;
          ptStack_48 = ptStack_48->nl_next) {
        local_4c = sys_trytoopenone(ptStack_48->nl_string,ext_local,dirresult_local,
                                    (char *)nameresult_local,ppcStack_38,nl._4_4_,bin);
        if (-1 < local_4c) {
          return local_4c;
        }
      }
      for (ptStack_48 = searchpath; ptStack_48 != (t_namelist *)0x0;
          ptStack_48 = ptStack_48->nl_next) {
        local_4c = sys_trytoopenone(ptStack_48->nl_string,ext_local,dirresult_local,
                                    (char *)nameresult_local,ppcStack_38,nl._4_4_,bin);
        if (-1 < local_4c) {
          return local_4c;
        }
      }
      if (sys_usestdpath != 0) {
        for (ptStack_48 = (pd_maininstance.pd_stuff)->st_staticpath; ptStack_48 != (t_namelist *)0x0
            ; ptStack_48 = ptStack_48->nl_next) {
          local_4c = sys_trytoopenone(ptStack_48->nl_string,ext_local,dirresult_local,
                                      (char *)nameresult_local,ppcStack_38,nl._4_4_,bin);
          if (-1 < local_4c) {
            return local_4c;
          }
        }
      }
      *(undefined1 *)nameresult_local = 0;
      *ppcStack_38 = (char *)nameresult_local;
      dir_local._4_4_ = -1;
    }
  }
  else {
    dir_local._4_4_ = local_4c;
  }
  return dir_local._4_4_;
}

Assistant:

static int do_open_via_path(const char *dir, const char *name,
    const char *ext, char *dirresult, char **nameresult, unsigned int size,
    int bin, t_namelist *searchpath)
{
    t_namelist *nl;
    int fd = -1;

        /* first check if "name" is absolute (and if so, try to open) */
    if (sys_open_absolute(name, ext, dirresult, nameresult, size, bin, &fd))
        return (fd);

        /* otherwise "name" is relative; try the directory "dir" first. */
    if ((fd = sys_trytoopenone(dir, name, ext,
        dirresult, nameresult, size, bin)) >= 0)
            return (fd);

        /* next go through the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    for (nl = searchpath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
            if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
                dirresult, nameresult, size, bin)) >= 0)
                    return (fd);

    *dirresult = 0;
    *nameresult = dirresult;
    return (-1);
}